

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

void __thiscall GmmLib::GmmPageTableMgr::GmmPageTableMgr(GmmPageTableMgr *this)

{
  GmmPageTableMgr *this_local;
  
  this->_vptr_GmmPageTableMgr = (_func_int **)&PTR_GetAuxL3TableAddr_002c0bf0;
  this->AuxTTObj = (AuxTable *)0x0;
  this->pPool = (GMM_PAGETABLEPool *)0x0;
  this->NumNodePoolElements = 0;
  this->pClientContext = (GmmClientContext *)0x0;
  this->hCsr = (HANDLE)0x0;
  memset(&this->DeviceCb,0,0x28);
  memset(&this->DeviceCbInt,0,0x20);
  return;
}

Assistant:

GmmLib::GmmPageTableMgr::GmmPageTableMgr()
{
    this->AuxTTObj            = NULL;
    this->pPool               = NULL;
    this->NumNodePoolElements = 0;
    this->pClientContext      = NULL;
    this->hCsr                = NULL;

    memset(&DeviceCb, 0, sizeof(GMM_DEVICE_CALLBACKS));
    memset(&DeviceCbInt, 0, sizeof(GMM_DEVICE_CALLBACKS_INT));
}